

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O0

void __thiscall
helics::CoreBroker::addSourceFilterToEndpoint
          (CoreBroker *this,string_view filter,string_view endpoint)

{
  string_view name;
  string_view string1;
  size_t in_RCX;
  ActionMessage *in_RDI;
  id in_R8;
  ActionMessage link;
  BrokerBase *this_00;
  action_t in_stack_fffffffffffffefc;
  ActionMessage *in_stack_ffffffffffffff00;
  undefined8 local_20;
  thread tStack_18;
  
  this_00 = (BrokerBase *)&stack0xffffffffffffff20;
  local_20 = in_RCX;
  tStack_18._M_id._M_thread = (id)(id)in_R8._M_thread;
  ActionMessage::ActionMessage(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
  name._M_str = (char *)this_00;
  name._M_len = (size_t)in_RDI;
  ActionMessage::name((ActionMessage *)0x50ed00,name);
  string1._M_str = (char *)tStack_18._M_id._M_thread;
  string1._M_len = local_20;
  ActionMessage::setStringData((ActionMessage *)this_00,string1);
  BrokerBase::addActionMessage(this_00,in_RDI);
  ActionMessage::~ActionMessage((ActionMessage *)this_00);
  return;
}

Assistant:

void CoreBroker::addSourceFilterToEndpoint(std::string_view filter, std::string_view endpoint)
{
    ActionMessage link(CMD_FILTER_LINK);
    link.name(filter);
    link.setStringData(endpoint);
    addActionMessage(std::move(link));
}